

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

BrandedDecl *
kj::_::
CopyConstructArray_<capnp::compiler::BrandedDecl,_capnp::compiler::BrandedDecl_*,_false,_false>::
apply(BrandedDecl *pos,BrandedDecl *start,BrandedDecl *end)

{
  BrandedDecl *pBVar1;
  ExceptionGuard local_28;
  
  local_28.start = pos;
  local_28.pos = pos;
  if (start != end) {
    do {
      capnp::compiler::BrandedDecl::BrandedDecl(local_28.pos,start);
      start = start + 1;
      local_28.pos = local_28.pos + 1;
    } while (start != end);
  }
  pBVar1 = local_28.pos;
  local_28.start = local_28.pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return pBVar1;
}

Assistant:

inline explicit ExceptionGuard(T* pos): start(pos), pos(pos) {}